

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

void __thiscall Web_Constraint::Constraint_Removed(Web_Constraint *this,Am_Slot *removing_slot)

{
  Am_Web_Data *this_00;
  bool bVar1;
  Output_Port *local_28;
  Output_Port *curr;
  Output_Port *prev;
  Am_Slot *removing_slot_local;
  Web_Constraint *this_local;
  
  curr = (Output_Port *)0x0;
  local_28 = this->owner->out_list;
  while( true ) {
    if (local_28 == (Output_Port *)0x0) {
      return;
    }
    bVar1 = Am_Slot::operator==(&local_28->context,removing_slot);
    if (bVar1) break;
    curr = local_28;
    local_28 = local_28->next;
  }
  if (curr == (Output_Port *)0x0) {
    this->owner->out_list = local_28->next;
  }
  else {
    curr->next = local_28->next;
  }
  local_28->next = (Output_Port *)0x0;
  if (local_28 != (Output_Port *)0x0) {
    Output_Port::operator_delete(local_28,0x10);
  }
  if ((this->owner->create_proc != (Am_Web_Create_Proc *)0x0) &&
     (bVar1 = (*this->owner->create_proc)(removing_slot), bVar1)) {
    if (this->owner->in_list != (Input_Port *)0x0) {
      Input_Port::Destroy(this->owner->in_list,&this->super_Am_Constraint);
      this->owner->in_list = (Input_Port *)0x0;
    }
    if (this->owner->out_list != (Output_Port *)0x0) {
      Output_Port::Destroy(this->owner->out_list,&this->super_Am_Constraint);
      this->owner->out_list = (Output_Port *)0x0;
    }
  }
  if (this->owner->in_list != (Input_Port *)0x0) {
    return;
  }
  if (this->owner->out_list != (Output_Port *)0x0) {
    return;
  }
  this_00 = this->owner;
  if (this_00 == (Am_Web_Data *)0x0) {
    return;
  }
  Am_Web_Data::~Am_Web_Data(this_00);
  operator_delete(this_00);
  return;
}

Assistant:

void
Web_Constraint::Constraint_Removed(const Am_Slot &removing_slot)
{
  Output_Port *prev = nullptr;
  Output_Port *curr = owner->out_list;
  while (curr) {
    if (curr->context == removing_slot) {
      if (prev)
        prev->next = curr->next;
      else
        owner->out_list = curr->next;
      curr->next = nullptr;
      delete curr;
      if (owner->create_proc && owner->create_proc(removing_slot)) {
        if (owner->in_list) {
          owner->in_list->Destroy(this);
          owner->in_list = nullptr;
        }
        if (owner->out_list) {
          owner->out_list->Destroy(this);
          owner->out_list = nullptr;
        }
      }
      if (!owner->in_list && !owner->out_list)
        delete owner;
      break;
    }
    prev = curr;
    curr = curr->next;
  }
}